

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void load_reg_var(DisasContext_conflict1 *s,TCGv_i32 var,int reg)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i32 a2;
  TCGOpcode opc;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (reg == 0xf) {
    a2 = (TCGv_i32)(long)(int)((int)s->pc_curr + (uint)(s->thumb == 0) * 4 + 4);
    opc = INDEX_op_movi_i32;
  }
  else {
    if (tcg_ctx->cpu_R[reg] == var) {
      return;
    }
    a2 = tcg_ctx->cpu_R[reg] + (long)tcg_ctx;
    opc = INDEX_op_mov_i32;
  }
  tcg_gen_op2_aarch64(tcg_ctx,opc,(TCGArg)(var + (long)tcg_ctx),(TCGArg)a2);
  return;
}

Assistant:

static void load_reg_var(DisasContext *s, TCGv_i32 var, int reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (reg == 15) {
        tcg_gen_movi_i32(tcg_ctx, var, read_pc(s));
    } else {
        tcg_gen_mov_i32(tcg_ctx, var, tcg_ctx->cpu_R[reg]);
    }
}